

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_gather(Integer g_a,void *v,void *subscript,Integer c_flag,Integer nv)

{
  long in_RDI;
  long in_R8;
  char err_string_1 [256];
  char err_string [256];
  Integer in_stack_000002d8;
  Integer in_stack_000002e0;
  void *in_stack_000002e8;
  void *in_stack_000002f0;
  Integer in_stack_000002f8;
  int in_stack_00000304;
  double *in_stack_00000310;
  double *in_stack_00000318;
  void *in_stack_00000320;
  char local_228 [256];
  char local_128 [128];
  Integer in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  
  if (0 < in_R8) {
    if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
      sprintf(local_128,"%s: INVALID ARRAY HANDLE","nga_gather");
      pnga_error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    if (GA[in_RDI + 1000].actv == 0) {
      sprintf(local_228,"%s: ARRAY NOT ACTIVE","nga_gather");
      pnga_error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    GAstat.numgat = GAstat.numgat + 1;
    gai_gatscat_new(in_stack_00000304,in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,
                    in_stack_000002e0,in_stack_000002d8,in_stack_00000310,in_stack_00000318,
                    in_stack_00000320);
  }
  return;
}

Assistant:

void pnga_gather(Integer g_a, void* v, void *subscript, Integer c_flag, Integer nv)
{

  if (nv < 1) return;
  ga_check_handleM(g_a, "nga_gather");
  
  GAstat.numgat++;

#ifdef USE_GATSCAT_NEW
  gai_gatscat_new(GATHER,g_a,v,subscript,c_flag,nv,&GAbytes.gattot,&GAbytes.gatloc, NULL);
#else
  gai_gatscat(GATHER,g_a,v,subscript,nv,&GAbytes.gattot,&GAbytes.gatloc, NULL);
#endif

}